

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

FunctionBody * __thiscall
Js::ParseableFunctionInfo::Parse
          (ParseableFunctionInfo *this,ScriptFunction **functionRef,bool isByteCodeDeserialization)

{
  undefined1 *puVar1;
  byte *pbVar2;
  undefined2 uVar3;
  ushort uVar4;
  uint uVar5;
  Type TVar6;
  Type TVar7;
  Type TVar8;
  Type TVar9;
  FunctionInfo *pFVar10;
  SourceContextInfo *pSVar11;
  NestedArray *pNVar12;
  SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  ScriptContext *pSVar13;
  ThreadContext *pTVar14;
  Type pSVar15;
  code *pcVar16;
  char16_t *pcVar17;
  ParseNodeProg *pnode;
  AutoDynamicCodeReference func;
  bool bVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  HRESULT HVar23;
  undefined4 *puVar24;
  FunctionBody *pFVar25;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar26;
  size_t extraout_RAX;
  undefined4 extraout_var_01;
  Utf8SourceInfo *pUVar27;
  LPCUTF8 pSrc;
  undefined4 *puVar28;
  undefined4 extraout_var_02;
  ulong uVar29;
  ScopeInfo *parentScopeInfo;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 extraout_RAX_00;
  undefined8 uVar30;
  uint uVar31;
  uint uVar32;
  byte bVar33;
  undefined8 unaff_R12;
  undefined7 uVar34;
  char cVar35;
  uint uVar36;
  undefined1 local_bf8 [8];
  char16 debugStringBuffer [42];
  undefined1 local_150 [8];
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  CompileScriptException se;
  uint nextFunctionId;
  undefined1 auStack_b8 [8];
  AutoRestoreFunctionInfo autoRestoreFunctionInfo;
  ParseNodeProg *local_98;
  ParseNodeProg *parseTree;
  AutoDynamicCodeReference dynamicFunctionReference;
  ParseableFunctionInfo *rootFunc;
  HRESULT local_64;
  char cStack_60;
  HRESULT hrParser;
  ulong local_58;
  ulong local_50;
  byte local_45;
  Type local_44;
  ulong local_40;
  AutoHandledExceptionType local_36;
  bool local_35;
  uint local_34;
  AutoHandledExceptionType __autoHandledExceptionType;
  
  if ((ParseableFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar24 = 1;
    bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0x8f2,"(this == this->GetFunctionInfo()->GetFunctionProxy())",
                                 "this == this->GetFunctionInfo()->GetFunctionProxy()");
    if (!bVar18) goto LAB_0076c3d6;
    *puVar24 = 0;
  }
  if ((this->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar24 = 1;
    bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar18) goto LAB_0076c3d6;
    *puVar24 = 0;
  }
  if ((ParseableFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar24 = 1;
    bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                 "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar18) goto LAB_0076c3d6;
    *puVar24 = 0;
  }
  pFVar10 = (this->super_FunctionProxy).functionInfo.ptr;
  if ((pFVar10->attributes & DeferredParse) == None) {
    bVar18 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (!bVar18) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    bVar18 = IsFunctionParsed(this);
    if (!bVar18) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x8f6,"(GetFunctionBody()->IsFunctionParsed())",
                                   "GetFunctionBody()->IsFunctionParsed()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    bVar18 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (bVar18) {
      return (FunctionBody *)this;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar24 = 1;
    bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (bVar18) {
      *puVar24 = 0;
      return (FunctionBody *)this;
    }
    goto LAB_0076c3d6;
  }
  autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
  autoRestoreFunctionInfo.funcBody =
       (FunctionBody *)InterpreterStackFrame::DelayDynamicInterpreterThunk;
  pFVar25 = (FunctionBody *)this;
  auStack_b8 = (undefined1  [8])this;
  if (((this->super_FunctionProxy).field_0x45 & 2) == 0) {
    pUVar27 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    Utf8SourceInfo::StopTrackingDeferredFunction
              (pUVar27,((this->super_FunctionProxy).functionInfo.ptr)->functionId);
    pFVar25 = FunctionBody::NewFromParseableFunctionInfo(this);
    pSVar11 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->
              sourceContextInfo).ptr;
    autoRestoreFunctionInfo.pfi = &pFVar25->super_ParseableFunctionInfo;
    if ((pSVar11->dwHostSourceContext == 0xffffffffffffffff) ||
       ((pSVar11->isHostDynamicDocument & 1U) != 0)) {
      bVar18 = Phases::IsEnabled((Phases *)&DAT_015d3490,DeferParsePhase);
      if (bVar18) {
        uVar5 = (this->super_FunctionProxy).m_functionNumber;
        iVar20 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[7])(this);
        pNVar12 = (this->nestedArray).ptr;
        if (pNVar12 == (NestedArray *)0x0) {
          uVar29 = 0;
        }
        else {
          uVar29 = (ulong)pNVar12->nestedCount;
        }
        pUVar27 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
        pcVar17 = L"LdTrue";
        if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
          pcVar17 = L"LdFalse";
        }
        Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"
                      ,(ulong)uVar5,CONCAT44(extraout_var_01,iVar20),(ulong)this->m_cchLength,uVar29
                      ,(ulong)pUVar27->m_sourceInfoId,(ulong)pUVar27->m_cchLength,pcVar17 + 2);
        goto LAB_0076b49b;
      }
    }
    else {
      bVar18 = Phases::IsEnabled((Phases *)&DAT_015d3490,DeferParsePhase);
      if (bVar18) {
        uVar5 = (this->super_FunctionProxy).m_functionNumber;
        iVar20 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[7])(this);
        pNVar12 = (this->nestedArray).ptr;
        if (pNVar12 == (NestedArray *)0x0) {
          uVar29 = 0;
        }
        else {
          uVar29 = (ulong)pNVar12->nestedCount;
        }
        pUVar27 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
        pcVar17 = L"LdTrue";
        if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
          pcVar17 = L"LdFalse";
        }
        Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"
                      ,(ulong)uVar5,CONCAT44(extraout_var,iVar20),(ulong)this->m_cchLength,uVar29,
                      (ulong)pUVar27->m_sourceInfoId,(ulong)pUVar27->m_cchLength,pcVar17 + 2,
                      (((((pUVar27->m_srcInfo).ptr)->sourceContextInfo).ptr)->field_5).field_0.url);
LAB_0076b49b:
        Output::Flush();
      }
    }
    if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
      pSVar11 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->
                sourceContextInfo).ptr;
      local_40 = local_40 & 0xffffffff00000000;
      if ((pSVar11->dwHostSourceContext == 0xffffffffffffffff) ||
         ((pSVar11->isHostDynamicDocument & 1U) != 0)) goto LAB_0076b575;
      bVar18 = ScriptContext::DoUndeferGlobalFunctions((this->super_FunctionProxy).m_scriptContext);
      if (bVar18) {
        pUVar27 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
        bVar18 = ScriptContext::DoUndeferGlobalFunctions((pUVar27->m_scriptContext).ptr);
        if (bVar18) {
          if ((pUVar27->field_0xa8 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar24 = 1;
            bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                         ,0x14e,"(m_deferredFunctionsInitialized)",
                                         "m_deferredFunctionsInitialized");
            if (!bVar18) goto LAB_0076c3d6;
            *puVar24 = 0;
          }
          this_00 = (pUVar27->m_deferredFunctionsDictionary).ptr;
          if (this_00 !=
              (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
               *)0x0) {
            (pUVar27->m_deferredFunctionsDictionary).ptr =
                 (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                  *)0x0;
            JsUtil::
            SynchronizedDictionary<unsigned_int,Js::ParseableFunctionInfo*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
            ::MapAndRemoveIf<Js::ParseableFunctionInfo::Parse(Js::ScriptFunction**,bool)::__0>
                      ((SynchronizedDictionary<unsigned_int,Js::ParseableFunctionInfo*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
                        *)this_00,(anon_class_8_1_8991fb9c)this);
          }
        }
      }
    }
    local_40 = local_40 & 0xffffffff00000000;
  }
  else {
    bVar18 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode
                       ((this->super_FunctionProxy).m_scriptContext);
    if (bVar18) {
      bVar18 = (((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->field_0xa8 & 4) == 0;
      uVar34 = (undefined7)((ulong)unaff_R12 >> 8);
    }
    else {
      bVar18 = false;
      uVar34 = 0;
    }
    uVar3 = *(undefined2 *)&(this->super_FunctionProxy).field_0x45;
    bVar19 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (!bVar19) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar19 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar19) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    bVar33 = bVar18 | (byte)((ushort)uVar3 >> 9) & 1;
    local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71(uVar34,bVar33));
    auStack_b8 = (undefined1  [8])0x0;
    autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
    if (bVar33 != 0) {
      if (((((this->super_FunctionProxy).field_0x47 & 0x10) == 0) &&
          (bVar18 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode
                              ((this->super_FunctionProxy).m_scriptContext), !bVar18)) &&
         (((this->super_FunctionProxy).field_0x46 & 2) == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar24 = 1;
        bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                     ,0x955,
                                     "(funcBody->IsReparsed() || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() || m_isAsmjsMode)"
                                     ,
                                     "funcBody->IsReparsed() || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() || m_isAsmjsMode"
                                    );
        if (!bVar18) goto LAB_0076c3d6;
        *puVar24 = 0;
      }
      iVar20 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[7])(this);
      FunctionProxy::GetDebugNumberSet(&this->super_FunctionProxy,(wchar (*) [42])local_bf8);
      sVar26 = Output::Trace(DebuggerPhase,L"Full nested reparse of function: %s (%s)\n",
                             CONCAT44(extraout_var_00,iVar20),local_bf8);
      if (this[1].super_FunctionProxy.functionInfo.ptr != (FunctionInfo *)0x0) {
        CleanupToReparse(this);
        sVar26 = extraout_RAX;
      }
      local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71((int7)(sVar26 >> 8),1));
    }
  }
LAB_0076b575:
  if ((pFVar25->byteCodeBlock).ptr == (ByteBlock *)0x0) {
    if ((pFVar25->field_0x179 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x968,"(!funcBody->HasExecutionDynamicProfileInfo())",
                                   "!funcBody->HasExecutionDynamicProfileInfo()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    local_64 = 0;
    LeaveScriptObject<true,_false,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_false,_false> *)local_150,
               (this->super_FunctionProxy).m_scriptContext,&stack0xfffffffffffffff8);
    pSVar13 = (this->super_FunctionProxy).m_scriptContext;
    pTVar14 = pSVar13->threadContext;
    local_35 = pTVar14->reentrancySafeOrHandled;
    pTVar14->reentrancySafeOrHandled = true;
    pUVar27 = ScriptContext::GetSource(pSVar13,(pFVar25->super_ParseableFunctionInfo).m_sourceIndex)
    ;
    local_45 = pUVar27->field_0xa8;
    local_58 = (ulong)this->m_cbStartOffset;
    local_44 = this->m_cchStartOffset;
    _cStack_60 = (ulong)this->m_cbLength;
    pSrc = Utf8SourceInfo::GetSource
                     ((this->super_FunctionProxy).m_utf8SourceInfo.ptr,
                      L"ParseableFunctionInfo::GetStartOfDocument");
    uVar5 = (pFVar25->super_ParseableFunctionInfo).m_grfscr;
    uVar21 = uVar5 | 0x800000;
    uVar4 = *(ushort *)&(pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
    uVar5 = uVar5 & 0xffffefff;
    uVar22 = uVar5 | 0x1800000;
    uVar5 = uVar5 | 0x800000;
    if ((uVar4 >> 0xc & 1) != 0) {
      uVar22 = uVar21;
      uVar5 = uVar21;
    }
    if ((uVar4 & 4) != 0) {
      uVar22 = uVar5;
    }
    local_50 = CONCAT44(local_50._4_4_,uVar22);
    local_34 = (uint)(byte)(pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
    if ((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x4ea,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    if ((FunctionBody *)
        (((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != pFVar25) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x4eb,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                   "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    pFVar10 = (pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    TVar6 = pFVar10->attributes;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x4ff,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    if ((FunctionBody *)
        (((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != pFVar25) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x500,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                   "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    pFVar10 = (pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    TVar7 = pFVar10->attributes;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x568,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    if ((FunctionBody *)
        (((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != pFVar25) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x569,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                   "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    pFVar10 = (pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    TVar8 = pFVar10->attributes;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x56f,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    if ((FunctionBody *)
        (((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != pFVar25) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x570,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                   "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    pFVar10 = (pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    TVar9 = pFVar10->attributes;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x576,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    if ((FunctionBody *)
        (((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != pFVar25) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x577,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                   "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    uVar31 = (local_34 & 0x20) << 0x15;
    uVar22 = (TVar6 & Async) << 9;
    uVar32 = (TVar7 & Generator) << 0xd;
    uVar36 = (TVar8 & ClassConstructor) << 0x13;
    uVar21 = (((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
              attributes & ClassMethod) << 0x13 | (TVar9 & BaseConstructorKind) << 9;
    uVar5 = uVar21 | uVar36 | uVar32 | uVar22 | uVar31 | (uint)local_50 & 0x81ffbef7 | 0x4000;
    if ((char)local_40 == '\0') {
      uVar5 = uVar21 | uVar36 | uVar32 | uVar22 | uVar31 | (uint)local_50 & 0x81ffffff;
    }
    puVar24 = (undefined4 *)(ulong)uVar5;
    AutoHandledExceptionType::AutoHandledExceptionType
              (&local_36,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    se.hasLineNumberInfo = false;
    se._81_7_ = 0;
    __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
    __leaveScriptObject._36_4_ = 0;
    se.super_ScriptException.ichMin = 0;
    se.super_ScriptException.ichLim = 0;
    se.super_ScriptException.ei.wCode = 0;
    se.super_ScriptException.ei.wReserved = 0;
    se.super_ScriptException.ei._4_4_ = 0;
    se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
    se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
    se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
    se.super_ScriptException.ei.dwHelpContext = 0;
    se.super_ScriptException.ei._36_4_ = 0;
    se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
    se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
    se.super_ScriptException.ei.scode = 0;
    se.super_ScriptException.ei._60_4_ = 0;
    se.line._0_1_ = 0;
    Parser::Parser((Parser *)local_bf8,(this->super_FunctionProxy).m_scriptContext,
                   *(ushort *)&(pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45
                   >> 8 & 1,(PageAllocator *)0x0,false,0xaa8);
    local_98 = (ParseNodeProg *)0x0;
    if ((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      local_50 = 0;
      Throw::LogAssert();
      puVar28 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar28 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar28 = 0;
    }
    se.bstrLine._4_4_ =
         ((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionId;
    local_50 = 0;
    local_64 = Parser::ParseSourceWithOffset
                         ((Parser *)local_bf8,&local_98,pSrc,local_58,_cStack_60,local_44,
                          (bool)((local_45 & 2) >> 1),uVar5,
                          (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                          (LocalFunctionId *)((long)&se.bstrLine + 4),
                          (pFVar25->super_ParseableFunctionInfo).m_lineNumber,
                          (((((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.
                              m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr,
                          &pFVar25->super_ParseableFunctionInfo);
    if (local_64 < 0) {
      HVar23 = MapDeferredReparseError
                         (&local_64,(CompileScriptException *)&__leaveScriptObject.__exceptionCheck)
      ;
      local_50 = CONCAT44(extraout_var_04,HVar23);
      if (HVar23 == -0x7ff5ebe4) {
        local_50 = 0x800a141c;
      }
      else if ((-1 < HVar23) || (local_64 < 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar24 = 1;
        bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                     ,0x9d7,
                                     "(hrParseCodeGen == JSERR_AsmJsCompileError || (((HRESULT)(hrParseCodeGen)<0) && ((HRESULT)(hrParser) >= 0)))"
                                     ,"Syntax errors should never be detected on deferred re-parse")
        ;
        if (!bVar18) goto LAB_0076c3d6;
        *puVar24 = 0;
      }
      local_58 = local_58 & 0xffffffff00000000;
    }
    else {
      bVar18 = Phases::IsEnabled((Phases *)&DAT_015cd718,ByteCodePhase);
      if (bVar18) {
        iVar20 = (*(pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [7])(pFVar25);
        local_50 = 0;
        Output::Print(L"\nDeferred parse %s\n",CONCAT44(extraout_var_02,iVar20));
      }
      parseTree = (ParseNodeProg *)(this->super_FunctionProxy).m_scriptContext;
      JavascriptLibrary::BeginDynamicFunctionReferences
                ((((Type)parseTree)->super_ScriptContextBase).javascriptLibrary);
      local_50 = 0;
      uVar29 = 0;
      if ((char)local_40 != '\0') {
        pSVar15 = (this->super_FunctionProxy).m_scriptContext;
        uVar29 = CONCAT71((int7)((ulong)pSVar15 >> 8),(pSVar15->config).NoNative);
      }
      local_40 = uVar29;
      dynamicFunctionReference.m_scriptContext =
           (ScriptContext *)FunctionProxy::GetParseableFunctionInfo((FunctionProxy *)pFVar25);
      pnode = local_98;
      pSVar13 = (this->super_FunctionProxy).m_scriptContext;
      local_34 = (pFVar25->super_ParseableFunctionInfo).m_sourceIndex;
      parentScopeInfo = (ScopeInfo *)FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar25,ScopeInfo);
      HVar23 = GenerateByteCode(pnode,uVar5,pSVar13,
                                (ParseableFunctionInfo **)&dynamicFunctionReference,local_34,
                                (bool)(char)local_40,(Parser *)local_bf8,
                                (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                                parentScopeInfo,functionRef);
      func = dynamicFunctionReference;
      local_50 = CONCAT44(extraout_var_03,HVar23);
      if ((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar24 = 1;
        bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x553,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar18) goto LAB_0076c3d6;
        *puVar24 = 0;
      }
      if ((FunctionBody *)
          (((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
          functionBodyImpl).ptr != pFVar25) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar24 = 1;
        bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x554,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                     "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar18) goto LAB_0076c3d6;
        *puVar24 = 0;
      }
      FunctionInfo::SetParseableFunctionInfo
                ((pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr,
                 (ParseableFunctionInfo *)func.m_scriptContext);
      if (-1 >= HVar23) {
        if (HVar23 != -0x7999bffc) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar28 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar28 = 1;
          bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                       ,0x9ec,"(hrParseCodeGen == ((HRESULT)0x86664004L))",
                                       "hrParseCodeGen == SCRIPT_E_RECORDED");
          if (!bVar18) goto LAB_0076c3d6;
          *puVar28 = 0;
        }
        local_50 = (ulong)se.super_ScriptException.ei.pfnDeferredFillIn & 0xffffffff;
      }
      JavascriptLibrary::EndDynamicFunctionReferences
                (*(JavascriptLibrary **)&(parseTree->super_ParseNodeFnc).super_ParseNode.ichLim);
      local_58 = CONCAT44(local_58._4_4_,(int)CONCAT71((int7)((ulong)puVar24 >> 8),-1 < HVar23));
    }
    Parser::~Parser((Parser *)local_bf8);
    CompileScriptException::~CompileScriptException
              ((CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
    AutoHandledExceptionType::~AutoHandledExceptionType(&local_36);
    _cStack_60 = CONCAT44(hrParser,(int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1));
    local_40 = local_40 & 0xffffffff00000000;
    local_44 = 0;
    local_34 = 0;
    pSVar15 = (this->super_FunctionProxy).m_scriptContext;
    if (pSVar15 != (Type)0x0) {
      ThreadContext::DisposeOnLeaveScript(pSVar15->threadContext);
    }
    pTVar14->reentrancySafeOrHandled = local_35;
    LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_false,_false> *)local_150);
    if ((char)local_40 != '\0') {
      JavascriptError::ThrowOutOfMemoryError((this->super_FunctionProxy).m_scriptContext);
    }
    if ((char)local_44 != '\0') {
LAB_0076c199:
      JavascriptError::ThrowStackOverflowError
                ((this->super_FunctionProxy).m_scriptContext,(PVOID)0x0);
    }
    if ((char)local_34 == '\x01') {
      uVar30 = __cxa_allocate_exception(1);
      __cxa_throw(uVar30,&NotImplementedException::typeinfo,0);
    }
    cVar35 = (char)local_58;
    if (cStack_60 == '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar24 = 1;
      bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x9f7,"(hr == 0L)","hr == NO_ERROR");
      if (!bVar18) goto LAB_0076c3d6;
      *puVar24 = 0;
    }
    if (local_64 < 0) {
      JavascriptError::ThrowError
                ((this->super_FunctionProxy).m_scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
    }
    iVar20 = (int)local_50;
    if ((iVar20 < 0) && (iVar20 != -0x7ff5ebe4)) {
      if (iVar20 != -0x7ff5ffe4) {
        JavascriptError::MapAndThrowError((this->super_FunctionProxy).m_scriptContext,iVar20);
      }
      goto LAB_0076c199;
    }
    bVar33 = (byte)(local_50 >> 0x18) >> 7;
  }
  else {
    cVar35 = '\0';
    bVar33 = 0;
  }
  if (bVar33 == 0) {
    auStack_b8 = (undefined1  [8])0x0;
    autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
  }
  AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)auStack_b8);
  if (cVar35 == '\0') {
    if (bVar33 == 0) {
      bVar18 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
      pFVar25 = (FunctionBody *)this;
      if (!bVar18) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar24 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar24 = 1;
        bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar18) {
LAB_0076c3d6:
          pcVar16 = (code *)invalidInstructionException();
          (*pcVar16)();
        }
        *puVar24 = 0;
      }
    }
    else {
      pFVar25 = (FunctionBody *)0x0;
    }
  }
  else {
    *(ushort *)&(pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
         *(ushort *)&(pFVar25->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0xffbf
         | *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x40;
    puVar1 = &(this->super_FunctionProxy).field_0x45;
    *puVar1 = *puVar1 | 2;
  }
  if (bVar33 != 0) {
    pbVar2 = (byte *)((long)&this->m_grfscr + 1);
    *pbVar2 = *pbVar2 | 0x40;
    pFVar25 = Parse(this,functionRef,isByteCodeDeserialization);
  }
  return pFVar25;
}

Assistant:

FunctionBody* ParseableFunctionInfo::Parse(ScriptFunction ** functionRef, bool isByteCodeDeserialization)
    {
        Assert(this == this->GetFunctionInfo()->GetFunctionProxy());
        if (!IsDeferredParseFunction())
        {
            // If not deferredparsed, the functionBodyImpl and this will be the same, just return the current functionBody.
            Assert(GetFunctionBody()->IsFunctionParsed());
            return GetFunctionBody();
        }

        bool asmjsParseFailed = false;
        BOOL fParsed = FALSE;
        FunctionBody* returnFunctionBody = nullptr;

        bool isDebugOrAsmJsReparse = false;
        FunctionBody* funcBody = nullptr;

        {
            AutoRestoreFunctionInfo autoRestoreFunctionInfo(this, DefaultEntryThunk);


            // If m_hasBeenParsed = true, one of the following things happened things happened:
            // - We had multiple function objects which were all defer-parsed, but with the same function body and one of them
            //   got the body to be parsed before another was called
            // - We are in debug mode and had our thunks switched to DeferParseThunk
            // - This is an already parsed asm.js module, which has been invalidated at link time and must be reparsed as a non-asm.js function
            if (!this->m_hasBeenParsed)
            {
                this->GetUtf8SourceInfo()->StopTrackingDeferredFunction(this->GetLocalFunctionId());
                funcBody = FunctionBody::NewFromParseableFunctionInfo(this);
                autoRestoreFunctionInfo.funcBody = funcBody;

                PERF_COUNTER_DEC(Code, DeferredFunction);

                if (!this->GetSourceContextInfo()->IsDynamic())
                {
                    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"), this->GetSourceContextInfo()->url);
                }
                else
                {
                    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(),  this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"));
                }

                if (!this->GetIsTopLevel() &&
                    !this->GetSourceContextInfo()->IsDynamic() &&
                    this->m_scriptContext->DoUndeferGlobalFunctions())
                {
                    this->GetUtf8SourceInfo()->UndeferGlobalFunctions([this](const Utf8SourceInfo::DeferredFunctionsDictionary::EntryType& func)
                    {
                        Js::ParseableFunctionInfo *nextFunc = func.Value();
                        JavascriptExceptionObject* pExceptionObject = nullptr;

                        if (nextFunc != nullptr && this != nextFunc)
                        {
                            try
                            {
                                nextFunc->Parse();
                            }
                            catch (OutOfMemoryException) {}
                            catch (StackOverflowException) {}
                            catch (const Js::JavascriptException& err)
                            {
                                pExceptionObject = err.GetAndClear();
                            }

                            // Do not do anything with an OOM or SOE, returning true is fine, it will then be undeferred (or attempted to again when called)
                            if (pExceptionObject)
                            {
                                if (pExceptionObject != ThreadContext::GetContextForCurrentThread()->GetPendingOOMErrorObject() &&
                                    pExceptionObject != ThreadContext::GetContextForCurrentThread()->GetPendingSOErrorObject())
                                {
                                    JavascriptExceptionOperators::DoThrow(pExceptionObject, /*scriptContext*/nullptr);
                                }
                            }
                        }

                        return true;
                    });
                }
            }
            else
            {
                bool isDebugReparse = m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() && !this->GetUtf8SourceInfo()->GetIsLibraryCode();
                bool isAsmJsReparse = m_isAsmjsMode && !isDebugReparse;

                isDebugOrAsmJsReparse = isAsmJsReparse || isDebugReparse;

                funcBody = this->GetFunctionBody();

                // As we have a valid function body already clear the restore data
                autoRestoreFunctionInfo.Clear();

                if (isDebugOrAsmJsReparse)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
#if DBG
                    Assert(
                        funcBody->IsReparsed()
                        || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode()
                        || m_isAsmjsMode);
#endif
                    OUTPUT_TRACE(Js::DebuggerPhase, _u("Full nested reparse of function: %s (%s)\n"), funcBody->GetDisplayName(), funcBody->GetDebugNumberSet(debugStringBuffer));

                    if (funcBody->GetByteCode())
                    {
                        // The current function needs to be cleaned up before getting generated in the debug mode.
                        funcBody->CleanupToReparse();
                    }

                }
            }

            // Note that we may be trying to re-gen an already-completed function. (This can happen, for instance,
            // in the case of named function expressions inside "with" statements in compat mode.)
            // In such a case, there's no work to do.
            if (funcBody->GetByteCode() == nullptr)
            {
#if ENABLE_PROFILE_INFO
                Assert(!funcBody->HasExecutionDynamicProfileInfo());
#endif
                // In debug or asm.js mode, the scriptlet will be asked to recompile again.

                HRESULT hr = NO_ERROR;
                HRESULT hrParser = NO_ERROR;
                HRESULT hrParseCodeGen = NO_ERROR;

                BEGIN_LEAVE_SCRIPT_INTERNAL(m_scriptContext)
                {
                    bool isCesu8 = m_scriptContext->GetSource(funcBody->GetSourceIndex())->IsCesu8();

                    size_t offset = this->StartOffset();
                    charcount_t charOffset = this->StartInDocument();
                    size_t length = this->LengthInBytes();

                    LPCUTF8 pszStart = this->GetStartOfDocument();

                    uint32 grfscr = funcBody->GetGrfscr() | fscrDeferredFnc;

                    // For the global function we want to re-use the glo functionbody which is already created in the non-debug mode
                    if (!funcBody->GetIsGlobalFunc())
                    {
                        grfscr &= ~fscrGlobalCode;
                    }

                    if (!funcBody->GetIsDeclaration() && !funcBody->GetIsGlobalFunc()) // No refresh may reparse global function (e.g. eval code)
                    {
                        // Notify the parser that the top-level function was defined in an expression,
                        // (not a function declaration statement).
                        grfscr |= fscrDeferredFncExpression;
                    }

                    if (funcBody->IsMethod())
                    {
                        grfscr |= fscrDeferredFncIsMethod;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsMethod;
                    }

                    if (funcBody->IsAsync())
                    {
                        grfscr |= fscrDeferredFncIsAsync;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsAsync;
                    }

                    if (funcBody->IsGenerator())
                    {
                        grfscr |= fscrDeferredFncIsGenerator;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsGenerator;
                    }

                    if (funcBody->IsClassConstructor())
                    {
                        grfscr |= fscrDeferredFncIsClassConstructor;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsClassConstructor;
                    }

                    if (funcBody->IsBaseClassConstructor())
                    {
                        grfscr |= fscrDeferredFncIsBaseClassConstructor;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsBaseClassConstructor;
                    }

                    if (funcBody->IsClassMethod())
                    {
                        grfscr |= fscrDeferredFncIsClassMember;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsClassMember;
                    }

                    if (isDebugOrAsmJsReparse)
                    {
                        // Disable deferred parsing if not DeferNested, or doing a debug/asm.js re-parse
                        // Disable asm.js when debugging or if linking failed
                        // Disable parser state cache if we're debugging or reparsing asm.js
                        grfscr = fscrNoAsmJs | (grfscr & ~(fscrWillDeferFncParse | fscrCreateParserState));
                    }

                    BEGIN_TRANSLATE_EXCEPTION_TO_HRESULT
                    {
                        CompileScriptException se;
                        Parser ps(m_scriptContext, funcBody->GetIsStrictMode() ? TRUE : FALSE);
                        ParseNodeProg * parseTree = nullptr;

                        uint nextFunctionId = funcBody->GetLocalFunctionId();
                        hrParser = ps.ParseSourceWithOffset(&parseTree, pszStart, offset, length, charOffset, isCesu8, grfscr, &se,
                            &nextFunctionId, funcBody->GetRelativeLineNumber(), funcBody->GetSourceContextInfo(),
                            funcBody);
                        // Assert(FAILED(hrParser) || nextFunctionId == funcBody->deferredParseNextFunctionId || isDebugOrAsmJsReparse || isByteCodeDeserialization);

                        if (FAILED(hrParser))
                        {
                            hrParseCodeGen = MapDeferredReparseError(hrParser, se); // Map certain errors like OOM/SOE
                            AssertMsg(hrParseCodeGen == JSERR_AsmJsCompileError // AsmJsCompileError is not a syntax error
                                || (FAILED(hrParseCodeGen) && SUCCEEDED(hrParser)), "Syntax errors should never be detected on deferred re-parse");
                        }
                        else
                        {
                            TRACE_BYTECODE(_u("\nDeferred parse %s\n"), funcBody->GetDisplayName());
                            Js::AutoDynamicCodeReference dynamicFunctionReference(m_scriptContext);

                            bool forceNoNative = isDebugOrAsmJsReparse ? this->GetScriptContext()->IsInterpreted() : false;

                            ParseableFunctionInfo* rootFunc = funcBody->GetParseableFunctionInfo();
                            hrParseCodeGen = GenerateByteCode(parseTree, grfscr, m_scriptContext,
                                &rootFunc, funcBody->GetSourceIndex(),
                                forceNoNative, &ps, &se, funcBody->GetScopeInfo(), functionRef);
                            funcBody->SetParseableFunctionInfo(rootFunc);

                            if (SUCCEEDED(hrParseCodeGen))
                            {
                                fParsed = TRUE;
                            }
                            else
                            {
                                Assert(hrParseCodeGen == SCRIPT_E_RECORDED);
                                hrParseCodeGen = se.ei.scode;
                            }
                        }
                    }
                    END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
                }
                END_LEAVE_SCRIPT_INTERNAL(m_scriptContext);

                THROW_KNOWN_HRESULT_EXCEPTIONS(hr, m_scriptContext);

                Assert(hr == NO_ERROR);

                if (!SUCCEEDED(hrParser))
                {
                    JavascriptError::ThrowError(m_scriptContext, VBSERR_InternalError);
                }
                else if (!SUCCEEDED(hrParseCodeGen))
                {
                    /*
                     * VBSERR_OutOfStack is of type kjstError but we throw a (more specific) StackOverflowError when a hard stack
                     * overflow occurs. To keep the behavior consistent I'm special casing it here.
                     */
                    if (hrParseCodeGen == VBSERR_OutOfStack)
                    {
                        JavascriptError::ThrowStackOverflowError(m_scriptContext);
                    }
                    else if (hrParseCodeGen == JSERR_AsmJsCompileError)
                    {
                        asmjsParseFailed = true;
                    }
                    else
                    {
                        JavascriptError::MapAndThrowError(m_scriptContext, hrParseCodeGen);
                    }
                }
            }
            else
            {
                fParsed = FALSE;
            }